

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

DynamicType *
Js::PathTypeHandlerBase::CreateNewScopeObject<true>
          (ScriptContext *scriptContext,DynamicType *type,PropertyIdArray *propIds,
          PropertyAttributes extraAttributes,uint extraAttributesSlotCount)

{
  code *pcVar1;
  SimpleDictionaryTypeHandler *this;
  byte bVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *alloc;
  DynamicType *this_00;
  PropertyRecord *local_98;
  TrackAllocData local_80;
  byte local_51;
  PropertyRecord *pPStack_50;
  PropertyAttributes attributes;
  PropertyRecord *propertyRecord;
  PropertyId propertyId;
  uint i;
  SimpleDictionaryTypeHandler *typeHandler;
  Recycler *recycler;
  uint local_28;
  uint count;
  uint extraAttributesSlotCount_local;
  PropertyAttributes extraAttributes_local;
  PropertyIdArray *propIds_local;
  DynamicType *type_local;
  ScriptContext *scriptContext_local;
  
  recycler._4_4_ = propIds->count;
  local_28 = extraAttributesSlotCount;
  count._3_1_ = extraAttributes;
  _extraAttributesSlotCount_local = propIds;
  propIds_local = (PropertyIdArray *)type;
  type_local = (DynamicType *)scriptContext;
  typeHandler = (SimpleDictionaryTypeHandler *)ScriptContext::GetRecycler(scriptContext);
  _propertyId = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
                New((Recycler *)typeHandler,recycler._4_4_,0,0,true,true);
  for (propertyRecord._4_4_ = 0; propertyRecord._4_4_ < recycler._4_4_;
      propertyRecord._4_4_ = propertyRecord._4_4_ + 1) {
    propertyRecord._0_4_ = (&_extraAttributesSlotCount_local[1].count)[propertyRecord._4_4_];
    if ((Type)propertyRecord == 0xffffffff) {
      local_98 = (PropertyRecord *)0x0;
    }
    else {
      local_98 = ScriptContext::GetPropertyName((ScriptContext *)type_local,(Type)propertyRecord);
    }
    pPStack_50 = local_98;
    local_51 = 5;
    if (propertyRecord._4_4_ < local_28) {
      local_51 = count._3_1_;
      if ((Type)propertyRecord == 0x1cf) {
        local_51 = count._3_1_ & 0xbf;
      }
      local_51 = local_51 | 5;
    }
    SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
    Add<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false> *)
               _propertyId,local_98,local_51,(ScriptContext *)type_local);
  }
  bVar2 = DynamicTypeHandler::GetFlags(&_propertyId->super_DynamicTypeHandler);
  if ((bVar2 & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x7c1,"((typeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "Why does a newly created type handler have the IsPrototypeFlag set?"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this = typeHandler;
  *(int *)&type_local[0x32].typeHandler.ptr = *(int *)&type_local[0x32].typeHandler.ptr + 1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_80,(type_info *)&DynamicType::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
             ,0x7c7);
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)this,&local_80);
  this_00 = (DynamicType *)new<Memory::Recycler>(0x38,alloc,0x43c4b0);
  DynamicType::DynamicType
            (this_00,(DynamicType *)propIds_local,&_propertyId->super_DynamicTypeHandler,true,true);
  return this_00;
}

Assistant:

DynamicType * PathTypeHandlerBase::CreateNewScopeObject(ScriptContext *scriptContext, DynamicType *type, const PropertyIdArray *propIds, PropertyAttributes extraAttributes, uint extraAttributesSlotCount)
    {
        uint count = propIds->count;

        Recycler* recycler = scriptContext->GetRecycler();

        SimpleDictionaryTypeHandler* typeHandler = SimpleDictionaryTypeHandler::New(recycler, count, 0, 0, true, true);

        for (uint i = 0; i < count; i++)
        {
            PropertyId propertyId = propIds->elements[i];
            const PropertyRecord* propertyRecord = propertyId == Constants::NoProperty ? NULL : scriptContext->GetPropertyName(propertyId);
            // This will add the property as initialized and non-fixed.  That's fine because we will populate the property values on the
            // scope object right after this (see JavascriptOperators::OP_InitCachedScope).  We will not treat these properties as fixed.
            PropertyAttributes attributes = PropertyWritable | PropertyEnumerable;
            if (i < extraAttributesSlotCount)
            {
                attributes |= extraAttributes;
                if (skipLetAttrForArguments && propertyId == PropertyIds::arguments)
                {
                    // Do not add let attribute for built-in arguments symbol
                    attributes &= ~PropertyLet;
                }
            }
            typeHandler->Add(propertyRecord, attributes, scriptContext);
        }
        AssertMsg((typeHandler->GetFlags() & IsPrototypeFlag) == 0, "Why does a newly created type handler have the IsPrototypeFlag set?");

 #ifdef PROFILE_OBJECT_LITERALS
        scriptContext->objectLiteralSimpleDictionaryCount++;
 #endif

        type = RecyclerNew(recycler, DynamicType, type, typeHandler, /* isLocked = */ true, /* isShared = */ true);

        return type;
    }